

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O2

size_t __thiscall proto3_arena_unittest::NestedTestAllTypes::ByteSizeLong(NestedTestAllTypes *this)

{
  RepeatedPtrField<proto3_arena_unittest::NestedTestAllTypes> *this_00;
  anon_union_56_1_493b367e_for_NestedTestAllTypes_3 aVar1;
  void **ppvVar2;
  const_iterator cVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar5 = (size_t)*(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.repeated_child_;
  ppvVar2 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&this_00->super_RepeatedPtrFieldBase);
  cVar3 = google::protobuf::RepeatedPtrField<proto3_arena_unittest::NestedTestAllTypes>::end
                    (this_00);
  for (; ppvVar2 != cVar3.it_; ppvVar2 = ppvVar2 + 1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto3_arena_unittest::NestedTestAllTypes>((NestedTestAllTypes *)*ppvVar2);
    sVar5 = sVar5 + sVar4;
  }
  aVar1 = this->field_0;
  if (((undefined1  [56])aVar1 & (undefined1  [56])0x7) != (undefined1  [56])0x0) {
    if (((undefined1  [56])aVar1 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto3_arena_unittest::NestedTestAllTypes>((this->field_0)._impl_.child_);
      sVar5 = sVar5 + sVar4 + 1;
    }
    if (((undefined1  [56])aVar1 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto3_arena_unittest::TestAllTypes>((this->field_0)._impl_.payload_);
      sVar5 = sVar5 + sVar4 + 1;
    }
    if (((undefined1  [56])aVar1 & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto3_arena_unittest::TestAllTypes>((this->field_0)._impl_.lazy_payload_)
      ;
      sVar5 = sVar5 + sVar4 + 1;
    }
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t NestedTestAllTypes::ByteSizeLong() const {
  const NestedTestAllTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3_arena_unittest.NestedTestAllTypes)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto3_arena_unittest.NestedTestAllTypes repeated_child = 3;
    {
      total_size += 1UL * this_._internal_repeated_child_size();
      for (const auto& msg : this_._internal_repeated_child()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // .proto3_arena_unittest.NestedTestAllTypes child = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.child_);
    }
    // .proto3_arena_unittest.TestAllTypes payload = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.payload_);
    }
    // .proto3_arena_unittest.TestAllTypes lazy_payload = 4 [lazy = true];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.lazy_payload_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}